

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  UnitTestImpl *this_00;
  TestEventListeners *this_01;
  size_t thread_count_00;
  int local_484;
  string local_480;
  allocator<char> local_459;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  int local_378;
  int local_374;
  int gtest_retval_1;
  allocator<char> local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  int local_268;
  int local_264;
  int gtest_retval;
  allocator<char> local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  int local_178;
  allocator<char> local_171;
  pid_t child_pid;
  int local_14c;
  string local_148;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_60;
  int local_5c;
  int pipe_fd [2];
  GTestLog local_24;
  internal *local_20;
  size_t thread_count;
  NoExecDeathTest *this_local;
  
  thread_count = (size_t)this;
  local_20 = (internal *)GetThreadCount();
  if (local_20 != (internal *)0x1) {
    GTestLog::GTestLog(&local_24,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Varhagna[P]Course-Planner/googletest/googletest/src/gtest-death-test.cc"
                       ,0x462);
    poVar3 = GTestLog::GetStream(&local_24);
    DeathTestThreadWarning_abi_cxx11_((string *)pipe_fd,local_20,thread_count_00);
    std::operator<<(poVar3,(string *)pipe_fd);
    std::__cxx11::string::~string((string *)pipe_fd);
    GTestLog::~GTestLog(&local_24);
  }
  do {
    iVar2 = pipe(&local_60);
    bVar1 = IsTrue(iVar2 != -1);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"CHECK failed: File ",&local_121);
      std::operator+(&local_100,&local_120,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Varhagna[P]Course-Planner/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_e0,&local_100,", line ");
      local_14c = 0x466;
      StreamableToString<int>(&local_148,&local_14c);
      std::operator+(&local_c0,&local_e0,&local_148);
      std::operator+(&local_a0,&local_c0,": ");
      std::operator+(&local_80,&local_a0,"pipe(pipe_fd) != -1");
      DeathTestAbort(&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&child_pid,"",&local_171);
  DeathTest::set_last_death_test_message((string *)&child_pid);
  std::__cxx11::string::~string((string *)&child_pid);
  std::allocator<char>::~allocator(&local_171);
  CaptureStderr();
  FlushInfoLog();
  local_178 = fork();
  do {
    bVar1 = IsTrue(local_178 != -1);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"CHECK failed: File ",&local_239);
      std::operator+(&local_218,&local_238,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Varhagna[P]Course-Planner/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_1f8,&local_218,", line ");
      local_264 = 0x474;
      StreamableToString<int>((string *)&gtest_retval,&local_264);
      std::operator+(&local_1d8,&local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &gtest_retval);
      std::operator+(&local_1b8,&local_1d8,": ");
      std::operator+(&local_198,&local_1b8,"child_pid != -1");
      DeathTestAbort(&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&gtest_retval);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  ForkingDeathTest::set_child_pid(&this->super_ForkingDeathTest,local_178);
  if (local_178 == 0) {
    do {
      do {
        local_268 = close(local_60);
        bVar1 = false;
        if (local_268 == -1) {
          piVar4 = __errno_location();
          bVar1 = *piVar4 == 4;
        }
      } while (bVar1);
      if (local_268 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,"CHECK failed: File ",&local_349);
        std::operator+(&local_328,&local_348,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Varhagna[P]Course-Planner/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_308,&local_328,", line ");
        local_374 = 0x477;
        StreamableToString<int>((string *)&gtest_retval_1,&local_374);
        std::operator+(&local_2e8,&local_308,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_retval_1);
        std::operator+(&local_2c8,&local_2e8,": ");
        std::operator+(&local_2a8,&local_2c8,"close(pipe_fd[0])");
        std::operator+(&local_288,&local_2a8," != -1");
        DeathTestAbort(&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&gtest_retval_1);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_348);
        std::allocator<char>::~allocator(&local_349);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_write_fd((DeathTestImpl *)this,local_5c);
    LogToStderr();
    this_00 = GetUnitTestImpl();
    this_01 = UnitTestImpl::listeners(this_00);
    TestEventListeners::SuppressEventForwarding(this_01);
    g_in_fast_death_test_child = 1;
    this_local._4_4_ = EXECUTE_TEST;
  }
  else {
    do {
      do {
        local_378 = close(local_5c);
        bVar1 = false;
        if (local_378 == -1) {
          piVar4 = __errno_location();
          bVar1 = *piVar4 == 4;
        }
      } while (bVar1);
      if (local_378 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_458,"CHECK failed: File ",&local_459);
        std::operator+(&local_438,&local_458,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Varhagna[P]Course-Planner/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_418,&local_438,", line ");
        local_484 = 0x483;
        StreamableToString<int>(&local_480,&local_484);
        std::operator+(&local_3f8,&local_418,&local_480);
        std::operator+(&local_3d8,&local_3f8,": ");
        std::operator+(&local_3b8,&local_3d8,"close(pipe_fd[1])");
        std::operator+(&local_398,&local_3b8," != -1");
        DeathTestAbort(&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_458);
        std::allocator<char>::~allocator(&local_459);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    DeathTestImpl::set_read_fd((DeathTestImpl *)this,local_60);
    DeathTestImpl::set_spawned((DeathTestImpl *)this,true);
    this_local._4_4_ = OVERSEE_TEST;
  }
  return this_local._4_4_;
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}